

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_PushBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
TestBody(ParticleArrayTest_PushBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
         *this)

{
  int iVar1;
  bool bVar2;
  AssertHelper AStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  String local_98;
  ParticleArray particles;
  AssertionResult gtest_ar_;
  ParticleArray particlesCopy;
  
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = 0x11;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              ((Particle *)&particlesCopy,
               (BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this);
    std::
    vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ::push_back(&particles.particles,(Particle *)&particlesCopy);
  }
  std::
  vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>::
  vector(&particlesCopy.particles,&particles.particles);
  gtest_ar_.success_ =
       ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
                        ,&particles,&particlesCopy);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_98,&gtest_ar_,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x75,local_98.c_str_);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    testing::internal::String::~String(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::
  _Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                   *)&particlesCopy);
  std::
  _Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                   *)&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PushBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 17; i++)
        particles.pushBack(this->randomParticle());
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}